

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O0

void re_reset(re_context *ctx)

{
  long in_RDI;
  int i;
  undefined4 local_c;
  
  for (local_c = 0; local_c < *(int *)(in_RDI + 8); local_c = local_c + 1) {
    if (*(long *)(*(long *)(in_RDI + 0x10) + (long)local_c * 0x20 + 0x10) != 0) {
      free(*(void **)(*(long *)(in_RDI + 0x10) + (long)local_c * 0x20 + 0x10));
      *(undefined8 *)(*(long *)(in_RDI + 0x10) + (long)local_c * 0x20 + 0x10) = 0;
    }
  }
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  return;
}

Assistant:

static void re_reset(re_context *ctx)
{
    int i;
    
    /* delete any range tables we've allocated */
    for (i = 0 ; i < ctx->next_state ; ++i)
    {
        if (ctx->tuple_arr[i].char_range != 0)
        {
            mchfre(ctx->tuple_arr[i].char_range);
            ctx->tuple_arr[i].char_range = 0;
        }
    }

    /* clear states */
    ctx->next_state = RE_STATE_FIRST_VALID;

    /* clear groups */
    ctx->cur_group = 0;
}